

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::LDX(CPU *this,uint8_t argument)

{
  byte bVar1;
  undefined3 in_register_00000031;
  
  this->X = argument;
  if (CONCAT31(in_register_00000031,argument) == 0) {
    bVar1 = this->field_0x2e | 0x40;
  }
  else {
    bVar1 = this->field_0x2e & 0xbf;
    if ((char)argument < '\0') {
      bVar1 = bVar1 | 1;
      goto LAB_001100bc;
    }
  }
  bVar1 = bVar1 & 0xfe;
LAB_001100bc:
  this->field_0x2e = bVar1;
  return;
}

Assistant:

void CPU::LDX(uint8_t argument) {
	X = argument;
	if (X == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (X & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
}